

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

int Str_MuxRestructArea_rec
              (Gia_Man_t *pNew,Str_Mux_t *pTree,Str_Mux_t *pRoot,int i,Vec_Int_t *vDelay,
              int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Str_Mux_t *pSVar4;
  Str_Mux_t *pMux_00;
  int nMuxes1;
  int nMuxes0;
  Str_Mux_t *pFanin1;
  Str_Mux_t *pFanin0;
  Str_Mux_t *pMux;
  int local_58;
  int fSkipMoving;
  int Path [4];
  int fVerbose_local;
  Vec_Int_t *vDelay_local;
  int i_local;
  Str_Mux_t *pRoot_local;
  Str_Mux_t *pTree_local;
  Gia_Man_t *pNew_local;
  
  if (pRoot->Edge[i].Fan < 1) {
    pNew_local._4_4_ = 0;
  }
  else {
    pSVar4 = Str_MuxFanin(pRoot,i);
    iVar1 = Str_MuxRestructArea_rec(pNew,pTree,pSVar4,0,vDelay,fVerbose);
    iVar2 = Str_MuxRestructArea_rec(pNew,pTree,pSVar4,1,vDelay,fVerbose);
    if (iVar1 + iVar2 < 2) {
      pNew_local._4_4_ = iVar1 + 1 + iVar2;
    }
    else if (iVar1 + iVar2 == 2) {
      if ((iVar1 == 2) || (iVar2 == 2)) {
        pMux_00 = Str_MuxFanin(pSVar4,(uint)(iVar2 == 2));
        iVar1 = Str_MuxHasFanin(pMux_00,0);
        iVar3 = Str_MuxHasFanin(pMux_00,1);
        if (iVar1 == iVar3) {
          __assert_fail("Str_MuxHasFanin(pFanin0, 0) != Str_MuxHasFanin(pFanin0, 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                        ,0x70a,
                        "int Str_MuxRestructArea_rec(Gia_Man_t *, Str_Mux_t *, Str_Mux_t *, int, Vec_Int_t *, int)"
                       );
        }
        Path[0] = Abc_Var2Lit(pRoot->Id,i);
        fSkipMoving = Abc_Var2Lit(pSVar4->Id,(uint)(iVar2 == 2));
        iVar1 = pMux_00->Id;
        iVar2 = Str_MuxHasFanin(pMux_00,1);
        local_58 = Abc_Var2Lit(iVar1,iVar2);
        Str_MuxChangeOnce(pTree,&local_58,0,2,(Str_Mux_t *)0x0,pNew,vDelay);
      }
      pSVar4 = Str_MuxFanin(pRoot,i);
      Str_MuxRestructAreaThree(pNew,pSVar4,vDelay,fVerbose);
      pNew_local._4_4_ = 0;
    }
    else {
      if ((iVar1 + iVar2 != 3) && (iVar1 + iVar2 != 4)) {
        __assert_fail("nMuxes0 + nMuxes1 == 3 || nMuxes0 + nMuxes1 == 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                      ,0x713,
                      "int Str_MuxRestructArea_rec(Gia_Man_t *, Str_Mux_t *, Str_Mux_t *, int, Vec_Int_t *, int)"
                     );
      }
      if ((iVar1 != 2) && (iVar2 != 2)) {
        __assert_fail("nMuxes0 == 2 || nMuxes1 == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                      ,0x714,
                      "int Str_MuxRestructArea_rec(Gia_Man_t *, Str_Mux_t *, Str_Mux_t *, int, Vec_Int_t *, int)"
                     );
      }
      Str_MuxRestructAreaThree(pNew,pSVar4,vDelay,fVerbose);
      pNew_local._4_4_ = 0;
    }
  }
  return pNew_local._4_4_;
}

Assistant:

int Str_MuxRestructArea_rec( Gia_Man_t * pNew, Str_Mux_t * pTree, Str_Mux_t * pRoot, int i, Vec_Int_t * vDelay, int fVerbose )
{
    int Path[4];
    int fSkipMoving = 1;
    Str_Mux_t * pMux, * pFanin0, * pFanin1;
    int nMuxes0, nMuxes1;
    if ( pRoot->Edge[i].Fan <= 0 )
        return 0;
    pMux    = Str_MuxFanin( pRoot, i );
    nMuxes0 = Str_MuxRestructArea_rec( pNew, pTree, pMux, 0, vDelay, fVerbose );
    nMuxes1 = Str_MuxRestructArea_rec( pNew, pTree, pMux, 1, vDelay, fVerbose );
    if ( nMuxes0 + nMuxes1 < 2 )
        return 1 + nMuxes0 + nMuxes1;
    if ( nMuxes0 + nMuxes1 == 2 )
    {
        if ( nMuxes0 == 2 || nMuxes1 == 2 )
        {
            pFanin0 = Str_MuxFanin( pMux, (int)(nMuxes1 == 2) );
            assert( Str_MuxHasFanin(pFanin0, 0) != Str_MuxHasFanin(pFanin0, 1) );
            Path[2] = Abc_Var2Lit(pRoot->Id, i);
            Path[1] = Abc_Var2Lit(pMux->Id, (int)(nMuxes1 == 2) );
            Path[0] = Abc_Var2Lit(pFanin0->Id, Str_MuxHasFanin(pFanin0, 1));
            Str_MuxChangeOnce( pTree, Path, 0, 2, NULL, pNew, vDelay );
        }
        Str_MuxRestructAreaThree( pNew, Str_MuxFanin(pRoot, i), vDelay, fVerbose );
        return 0;
    }
    assert( nMuxes0 + nMuxes1 == 3 || nMuxes0 + nMuxes1 == 4 );
    assert( nMuxes0 == 2 || nMuxes1 == 2 );
    if ( fSkipMoving )
    {
        Str_MuxRestructAreaThree( pNew, pMux, vDelay, fVerbose );
        return 0;
    }
    if ( nMuxes0 == 2 )
    {
        pFanin0 = Str_MuxFanin( pMux, 0 );
        assert( Str_MuxHasFanin(pFanin0, 0) != Str_MuxHasFanin(pFanin0, 1) );
        Path[3] = Abc_Var2Lit(pRoot->Id, i);
        Path[2] = Abc_Var2Lit(pMux->Id, 0 );
        Path[1] = Abc_Var2Lit(pFanin0->Id, Str_MuxHasFanin(pFanin0, 1));
        pFanin1 = Str_MuxFanin( pFanin0, Str_MuxHasFanin(pFanin0, 1) );
        assert( !Str_MuxHasFanin(pFanin1, 0) && !Str_MuxHasFanin(pFanin1, 1) );
        Path[0] = Abc_Var2Lit(pFanin1->Id, 0);
        Str_MuxChangeOnce( pTree, Path, 0, 3, NULL, pNew, vDelay );
    }
    if ( nMuxes1 == 2 )
    {
        pFanin0 = Str_MuxFanin( pMux, 1 );
        assert( Str_MuxHasFanin(pFanin0, 0) != Str_MuxHasFanin(pFanin0, 1) );
        Path[3] = Abc_Var2Lit(pRoot->Id, i);
        Path[2] = Abc_Var2Lit(pMux->Id, 1 );
        Path[1] = Abc_Var2Lit(pFanin0->Id, Str_MuxHasFanin(pFanin0, 1));
        pFanin1 = Str_MuxFanin( pFanin0, Str_MuxHasFanin(pFanin0, 1) );
        assert( !Str_MuxHasFanin(pFanin1, 0) && !Str_MuxHasFanin(pFanin1, 1) );
        Path[0] = Abc_Var2Lit(pFanin1->Id, 0);
        Str_MuxChangeOnce( pTree, Path, 0, 3, NULL, pNew, vDelay );
    }
    Str_MuxRestructAreaThree( pNew, pMux, vDelay, fVerbose );
    return nMuxes0 + nMuxes1 - 2;
}